

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter_inc.h
# Opt level: O0

void RandomSampleCommand(uint32_t *seed,uint16_t *data,size_t length,size_t stride,
                        HistogramCommand *sample)

{
  ulong local_58;
  size_t pos;
  HistogramCommand *sample_local;
  size_t stride_local;
  size_t length_local;
  uint16_t *data_local;
  uint32_t *seed_local;
  HistogramCommand *local_20;
  ushort *local_18;
  
  local_58 = 0;
  sample_local = (HistogramCommand *)length;
  if (stride < length) {
    *seed = *seed * 0x41a7;
    local_58 = (ulong)*seed % ((length - stride) + 1);
    sample_local = (HistogramCommand *)stride;
  }
  sample->total_count_ = (long)sample_local->data_ + sample->total_count_;
  local_20 = (HistogramCommand *)((long)sample_local->data_ + 1);
  local_18 = data + local_58;
  while (local_20 = (HistogramCommand *)((long)(local_20 + 0xffffffffffffffff) + 0xb0f),
        local_20 != (HistogramCommand *)0x0) {
    sample->data_[*local_18] = sample->data_[*local_18] + 1;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

static void FN(RandomSample)(uint32_t* seed,
                             const DataType* data,
                             size_t length,
                             size_t stride,
                             HistogramType* sample) {
  size_t pos = 0;
  if (stride >= length) {
    stride = length;
  } else {
    pos = MyRand(seed) % (length - stride + 1);
  }
  FN(HistogramAddVector)(sample, data + pos, stride);
}